

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddColumn(Parse *pParse,Token sName,Token sType)

{
  sqlite3 *db_00;
  Table *pTVar1;
  u8 uVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  Column *pCVar6;
  uint uVar7;
  bool bVar8;
  char local_73;
  u8 local_72;
  char local_71;
  char affinity;
  u8 szEst;
  u8 eType;
  Column *aNew;
  u8 hName;
  sqlite3 *db;
  Column *pCol;
  char *zType;
  char *z;
  int i;
  Table *p;
  Parse *pParse_local;
  Token sType_local;
  Token sName_local;
  
  pParse_local = (Parse *)sType.z;
  sType_local._8_8_ = sName.z;
  uVar7 = sName.n;
  sType_local.z._0_4_ = sType.n;
  db_00 = pParse->db;
  local_71 = '\0';
  local_72 = '\x01';
  local_73 = 'A';
  pTVar1 = pParse->pNewTable;
  if (pTVar1 != (Table *)0x0) {
    if (db_00->aLimit[2] < pTVar1->nCol + 1) {
      sqlite3ErrorMsg(pParse,"too many columns on %s",pTVar1->zName);
    }
    else {
      if (pParse->eParseMode < 2) {
        sqlite3DequoteToken((Token *)&sType_local.n);
      }
      if ((0xf < (uint)sType_local.z) &&
         (iVar4 = sqlite3_strnicmp((char *)((long)&pParse_local->db +
                                           (ulong)((uint)sType_local.z - 6)),"always",6), iVar4 == 0
         )) {
        sType_local.z._0_4_ = (uint)sType_local.z - 6;
        while( true ) {
          bVar8 = false;
          if ((uint)sType_local.z != 0) {
            bVar8 = (""[*(byte *)((long)&pParse_local->db + (ulong)((uint)sType_local.z - 1))] & 1)
                    != 0;
          }
          if (!bVar8) break;
          sType_local.z._0_4_ = (uint)sType_local.z - 1;
        }
        if ((8 < (uint)sType_local.z) &&
           (iVar4 = sqlite3_strnicmp((char *)((long)&pParse_local->db +
                                             (ulong)((uint)sType_local.z - 9)),"generated",9),
           iVar4 == 0)) {
          sType_local.z._0_4_ = (uint)sType_local.z - 9;
          while( true ) {
            bVar8 = false;
            if ((uint)sType_local.z != 0) {
              bVar8 = (""[*(byte *)((long)&pParse_local->db + (ulong)((uint)sType_local.z - 1))] & 1
                      ) != 0;
            }
            if (!bVar8) break;
            sType_local.z._0_4_ = (uint)sType_local.z - 1;
          }
        }
      }
      if (2 < (uint)sType_local.z) {
        sqlite3DequoteToken((Token *)&pParse_local);
        for (z._4_4_ = 0; z._4_4_ < 6; z._4_4_ = z._4_4_ + 1) {
          if (((uint)sType_local.z == "\x03\x04\x03\a\x04\x04"[z._4_4_]) &&
             (iVar4 = sqlite3_strnicmp((char *)pParse_local,sqlite3StdType[z._4_4_],
                                       (uint)sType_local.z), iVar4 == 0)) {
            sType_local.z._0_4_ = 0;
            local_71 = (char)z._4_4_ + '\x01';
            local_73 = "CADDEB"[z._4_4_];
            if (local_73 < 'C') {
              local_72 = '\x05';
            }
            break;
          }
        }
      }
      pcVar5 = (char *)sqlite3DbMallocRaw(db_00,(ulong)uVar7 + 1 + (ulong)(uint)sType_local.z +
                                                (long)(int)(uint)((uint)sType_local.z != 0));
      if (pcVar5 != (char *)0x0) {
        if (1 < pParse->eParseMode) {
          sqlite3RenameTokenMap(pParse,pcVar5,(Token *)&sType_local.n);
        }
        memcpy(pcVar5,(void *)sType_local._8_8_,(ulong)uVar7);
        pcVar5[uVar7] = '\0';
        sqlite3Dequote(pcVar5);
        uVar2 = sqlite3StrIHash(pcVar5);
        for (z._4_4_ = 0; z._4_4_ < pTVar1->nCol; z._4_4_ = z._4_4_ + 1) {
          if ((pTVar1->aCol[z._4_4_].hName == uVar2) &&
             (iVar4 = sqlite3StrICmp(pcVar5,pTVar1->aCol[z._4_4_].zCnName), iVar4 == 0)) {
            sqlite3ErrorMsg(pParse,"duplicate column name: %s",pcVar5);
            sqlite3DbFree(db_00,pcVar5);
            return;
          }
        }
        pCVar6 = (Column *)sqlite3DbRealloc(db_00,pTVar1->aCol,((long)pTVar1->nCol + 1) * 0x10);
        if (pCVar6 == (Column *)0x0) {
          sqlite3DbFree(db_00,pcVar5);
        }
        else {
          pTVar1->aCol = pCVar6;
          pCVar6 = pTVar1->aCol + pTVar1->nCol;
          memset(pCVar6,0,0x10);
          pCVar6->zCnName = pcVar5;
          pCVar6->hName = uVar2;
          if ((uint)sType_local.z == 0) {
            pCVar6->affinity = local_73;
            pCVar6->field_0x8 = pCVar6->field_0x8 & 0xf | local_71 << 4;
            pCVar6->szEst = local_72;
          }
          else {
            iVar4 = sqlite3Strlen30(pcVar5);
            pcVar5 = pcVar5 + (long)iVar4 + 1;
            memcpy(pcVar5,pParse_local,(ulong)(uint)sType_local.z);
            pcVar5[(uint)sType_local.z] = '\0';
            sqlite3Dequote(pcVar5);
            cVar3 = sqlite3AffinityType(pcVar5,pCVar6);
            pCVar6->affinity = cVar3;
            pCVar6->colFlags = pCVar6->colFlags | 4;
          }
          pTVar1->nCol = pTVar1->nCol + 1;
          pTVar1->nNVCol = pTVar1->nNVCol + 1;
          (pParse->constraintName).n = 0;
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token sName, Token sType){
  Table *p;
  int i;
  char *z;
  char *zType;
  Column *pCol;
  sqlite3 *db = pParse->db;
  u8 hName;
  Column *aNew;
  u8 eType = COLTYPE_CUSTOM;
  u8 szEst = 1;
  char affinity = SQLITE_AFF_BLOB;

  if( (p = pParse->pNewTable)==0 ) return;
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
  if( !IN_RENAME_OBJECT ) sqlite3DequoteToken(&sName);

  /* Because keywords GENERATE ALWAYS can be converted into indentifiers
  ** by the parser, we can sometimes end up with a typename that ends
  ** with "generated always".  Check for this case and omit the surplus
  ** text. */
  if( sType.n>=16
   && sqlite3_strnicmp(sType.z+(sType.n-6),"always",6)==0
  ){
    sType.n -= 6;
    while( ALWAYS(sType.n>0) && sqlite3Isspace(sType.z[sType.n-1]) ) sType.n--;
    if( sType.n>=9
     && sqlite3_strnicmp(sType.z+(sType.n-9),"generated",9)==0
    ){
      sType.n -= 9;
      while( sType.n>0 && sqlite3Isspace(sType.z[sType.n-1]) ) sType.n--;
    }
  }

  /* Check for standard typenames.  For standard typenames we will
  ** set the Column.eType field rather than storing the typename after
  ** the column name, in order to save space. */
  if( sType.n>=3 ){
    sqlite3DequoteToken(&sType);
    for(i=0; i<SQLITE_N_STDTYPE; i++){
       if( sType.n==sqlite3StdTypeLen[i]
        && sqlite3_strnicmp(sType.z, sqlite3StdType[i], sType.n)==0
       ){
         sType.n = 0;
         eType = i+1;
         affinity = sqlite3StdTypeAffinity[i];
         if( affinity<=SQLITE_AFF_TEXT ) szEst = 5;
         break;
       }
    }
  }

  z = sqlite3DbMallocRaw(db, (i64)sName.n + 1 + (i64)sType.n + (sType.n>0) );
  if( z==0 ) return;
  if( IN_RENAME_OBJECT ) sqlite3RenameTokenMap(pParse, (void*)z, &sName);
  memcpy(z, sName.z, sName.n);
  z[sName.n] = 0;
  sqlite3Dequote(z);
  hName = sqlite3StrIHash(z);
  for(i=0; i<p->nCol; i++){
    if( p->aCol[i].hName==hName && sqlite3StrICmp(z, p->aCol[i].zCnName)==0 ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  aNew = sqlite3DbRealloc(db,p->aCol,((i64)p->nCol+1)*sizeof(p->aCol[0]));
  if( aNew==0 ){
    sqlite3DbFree(db, z);
    return;
  }
  p->aCol = aNew;
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zCnName = z;
  pCol->hName = hName;
  sqlite3ColumnPropertiesFromName(p, pCol);

  if( sType.n==0 ){
    /* If there is no type specified, columns have the default affinity
    ** 'BLOB' with a default size of 4 bytes. */
    pCol->affinity = affinity;
    pCol->eCType = eType;
    pCol->szEst = szEst;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( affinity==SQLITE_AFF_BLOB ){
      if( 4>=sqlite3GlobalConfig.szSorterRef ){
        pCol->colFlags |= COLFLAG_SORTERREF;
      }
    }
#endif
  }else{
    zType = z + sqlite3Strlen30(z) + 1;
    memcpy(zType, sType.z, sType.n);
    zType[sType.n] = 0;
    sqlite3Dequote(zType);
    pCol->affinity = sqlite3AffinityType(zType, pCol);
    pCol->colFlags |= COLFLAG_HASTYPE;
  }
  p->nCol++;
  p->nNVCol++;
  pParse->constraintName.n = 0;
}